

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

void help(void)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  
  uVar3 = 1;
  fwrite("usage: imgtool <command> [options]\n\n",0x24,1,_stderr);
  fwrite("where <command> is:",0x13,1,_stderr);
  if ((_Rb_tree_header *)
      commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar1 = 0x20;
      if (uVar3 < commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        uVar1 = 0x2c;
      }
      fprintf(_stderr," %s%c",*(undefined8 *)(p_Var2 + 1),uVar1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      uVar3 = uVar3 + 1;
    } while ((_Rb_tree_header *)p_Var2 !=
             &commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  fwrite("\n\n",2,1,_stderr);
  fwrite("\"imgtool help <command>\" provides detailed information about <command>.\n",0x48,1,
         _stderr);
  return;
}

Assistant:

void help() {
    fprintf(stderr, "usage: imgtool <command> [options]\n\n");
    fprintf(stderr, "where <command> is:");
    int count = 0;
    for (const auto &cmd : commandUsage)
        fprintf(stderr, " %s%c", cmd.first.c_str(),
                ++count < commandUsage.size() ? ',' : ' ');
    fprintf(stderr, "\n\n");
    fprintf(stderr, "\"imgtool help <command>\" provides detailed information "
                    "about <command>.\n");
}